

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O3

bool __thiscall xray_re::xr_file_system::initialize(xr_file_system *this,char *fs_spec,uint flags)

{
  pointer pppVar1;
  bool bVar2;
  xr_reader *r;
  string folder;
  string local_90;
  string local_70;
  string local_50;
  
  if ((fs_spec == (char *)0x0) || (*fs_spec == '\0')) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,PA_FS_ROOT,0x1ed49c);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    add_path_alias(this,&local_50,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0015e7b5;
  }
  else {
    r = r_open(this,fs_spec);
    if (r == (xr_reader *)0x0) {
      return false;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    split_path(fs_spec,&local_50,(string *)0x0,(string *)0x0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,PA_FS_ROOT,0x1ed49c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    add_path_alias(this,&local_70,&local_50,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar2 = parse_fs_spec(this,r);
    if ((!bVar2) &&
       (pppVar1 = (this->m_aliases).
                  super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (this->m_aliases).
       super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
       ._M_impl.super__Vector_impl_data._M_finish != pppVar1)) {
      (this->m_aliases).
      super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pppVar1;
    }
    (*r->_vptr_xr_reader[1])(r);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0015e7b5;
  }
  operator_delete(local_50._M_dataplus._M_p,
                  CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                           local_50.field_2._M_local_buf[0]) + 1);
LAB_0015e7b5:
  this->m_flags = flags;
  return (this->m_aliases).
         super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->m_aliases).
         super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xr_file_system::initialize(const char* fs_spec, unsigned flags)
{
	if (fs_spec && fs_spec[0] != '\0') {
		xr_reader* r = r_open(fs_spec);
		if (r == 0)
			return false;
			
		std::string folder;
		split_path(fs_spec, &folder);
		add_path_alias(PA_FS_ROOT, folder, "");
		if (!parse_fs_spec(*r))
			this->m_aliases.clear();
		r_close(r);
	} else {
#if 0
		std::string folder;
		get_working_folder(folder);
#endif
		add_path_alias(PA_FS_ROOT, "", "");
	}
	m_flags = flags;
	return !m_aliases.empty();
}